

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

RangeSelectExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::RangeSelectExpression,slang::ast::RangeSelectionKind,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange&>
          (BumpAllocator *this,RangeSelectionKind *args,Type *args_1,Expression *args_2,
          Expression *args_3,Expression *args_4,SourceRange *args_5)

{
  SourceRange sourceRange;
  RangeSelectExpression *right;
  RangeSelectExpression *in_RCX;
  SourceLocation in_RSI;
  SourceLocation in_RDI;
  undefined8 in_R8;
  RangeSelectionKind selectionKind;
  Type *in_R9;
  undefined8 *in_stack_00000008;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  BumpAllocator *in_stack_ffffffffffffffc8;
  
  selectionKind = (RangeSelectionKind)((ulong)in_R8 >> 0x20);
  right = (RangeSelectExpression *)
          allocate(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  sourceRange.endLoc = in_RDI;
  sourceRange.startLoc = in_RSI;
  ast::RangeSelectExpression::RangeSelectExpression
            (in_RCX,selectionKind,in_R9,(Expression *)in_stack_00000008[1],
             (Expression *)*in_stack_00000008,(Expression *)right,sourceRange);
  return right;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }